

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rational.h
# Opt level: O3

Rational * __thiscall Rational::operator-(Rational *__return_storage_ptr__,Rational *this)

{
  BigInteger local_30;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)__return_storage_ptr__,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)this);
  (__return_storage_ptr__->_numerator).negative = (this->_numerator).negative;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&(__return_storage_ptr__->_denominator).digits,&(this->_denominator).digits);
  (__return_storage_ptr__->_denominator).negative = (this->_denominator).negative;
  BigInteger::operator-(&local_30,&__return_storage_ptr__->_numerator);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)__return_storage_ptr__,
             &local_30.digits);
  (__return_storage_ptr__->_numerator).negative = local_30.negative;
  if (local_30.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_30.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

const Rational operator-() const
    {
        Rational temp(*this);
        temp._numerator = -temp._numerator;
        return temp;
    }